

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O1

int CECoordinates::Galactic2Observed
              (double glon,double glat,double *az,double *zen,CEDate *date,CEObserver *observer,
              CEAngleType *angle_type,double wavelength,double *observed_glon,double *observed_glat,
              double *hour_angle)

{
  int iVar1;
  double *observed_glat_00;
  double *hour_angle_00;
  double julian_date;
  double longitude;
  double latitude;
  double elevation_m;
  double pressure_hPa;
  double temperature_celsius;
  double relative_humidity;
  double dut1;
  double xp;
  double yp;
  double local_90;
  double local_88;
  
  local_90 = glon;
  local_88 = glat;
  if (*angle_type == DEGREES) {
    local_90 = glon * 0.017453292519943295;
    local_88 = glat * 0.017453292519943295;
  }
  observed_glat_00 = (double *)angle_type;
  hour_angle_00 = observed_glon;
  (*date->_vptr_CEDate[4])(date);
  longitude = CEObserver::Longitude_Rad(observer);
  latitude = CEObserver::Latitude_Rad(observer);
  elevation_m = CEObserver::Elevation_m(observer);
  pressure_hPa = CEObserver::Pressure_hPa(observer);
  temperature_celsius = CEObserver::Temperature_C(observer);
  relative_humidity = CEObserver::RelativeHumidity(observer);
  dut1 = CEDate::dut1(date);
  xp = CEDate::xpolar(date);
  yp = CEDate::ypolar(date);
  iVar1 = Galactic2Observed((CECoordinates *)az,local_90,local_88,zen,observed_glon,julian_date,
                            longitude,latitude,elevation_m,pressure_hPa,temperature_celsius,
                            relative_humidity,dut1,xp,yp,wavelength,observed_glat,observed_glat_00,
                            hour_angle_00);
  if (*angle_type == DEGREES) {
    *az = *az * 57.29577951308232;
    *zen = *zen * 57.29577951308232;
    if (observed_glon != (double *)0x0) {
      *observed_glon = *observed_glon * 57.29577951308232;
    }
    if (observed_glat != (double *)0x0) {
      *observed_glat = *observed_glat * 57.29577951308232;
    }
    if (hour_angle != (double *)0x0) {
      *hour_angle = *hour_angle * 57.29577951308232;
    }
  }
  return iVar1;
}

Assistant:

int CECoordinates::Galactic2Observed(double glon, double glat,
                                     double *az, double *zen,
                                     const CEDate&     date,
                                     const CEObserver& observer,
                                     const CEAngleType& angle_type,
                                     double wavelength,
                                     double *observed_glon,
                                     double *observed_glat,
                                     double *hour_angle)
{
    // Convert angles to radians if necessary
    if (angle_type == CEAngleType::DEGREES) {
        glon *= DD2R ;
        glat *= DD2R ;
    }
    
    // Do the conversion
    int error_code = Galactic2Observed(glon, glat,
                                       az, zen,
                                       date.JD(),
                                       observer.Longitude_Rad(),
                                       observer.Latitude_Rad(),
                                       observer.Elevation_m(),
                                       observer.Pressure_hPa(),
                                       observer.Temperature_C(),
                                       observer.RelativeHumidity(),
                                       date.dut1(),
                                       date.xpolar(),
                                       date.ypolar(),
                                       wavelength,
                                       observed_glon, observed_glat, hour_angle) ;
    
    // Convert back to degrees if necessary
    if (angle_type == CEAngleType::DEGREES) {
        *az  *= DR2D ;
        *zen *= DR2D ;
        if (observed_glon != nullptr) *observed_glon *= DR2D ;
        if (observed_glat != nullptr) *observed_glat *= DR2D ;
        if (hour_angle    != nullptr) *hour_angle    *= DR2D ;
    }
    
    return error_code;
}